

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

bool ON_IsValidKnotVector(int order,int cv_count,double *knot,ON_TextLog *text_logx)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char *format;
  uint uVar10;
  ulong uVar11;
  ON_TextLog *this;
  
  this = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
  if (order < 2) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector order = %d (should be >= 2 )\n",(ulong)(uint)order);
    }
  }
  else if (cv_count < order) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector cv_count = %d (should be >= order=%d )\n",
                        (ulong)(uint)cv_count,(ulong)(uint)order);
    }
  }
  else if (knot == (double *)0x0) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector knot array = nullptr.\n");
    }
  }
  else {
    iVar1 = cv_count + order;
    if (2 < iVar1) {
      uVar9 = 0;
      do {
        bVar5 = ON_IsValid(knot[uVar9]);
        if (!bVar5) {
          if (this != (ON_TextLog *)0x0) {
            ON_TextLog::Print(this,"Knot vector knot[%d]=%g is not valid.\n",knot[uVar9],
                              uVar9 & 0xffffffff);
          }
          goto joined_r0x004c255d;
        }
        uVar9 = uVar9 + 1;
      } while (iVar1 - 2 != uVar9);
    }
    uVar9 = (ulong)(order - 2);
    uVar11 = (ulong)(order - 1);
    if (knot[uVar11] <= knot[uVar9]) {
      if (this == (ON_TextLog *)0x0) goto joined_r0x004c255d;
      format = 
      "Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n"
      ;
      uVar8 = (ulong)(uint)order;
    }
    else {
      uVar2 = cv_count - 2;
      uVar9 = (ulong)uVar2;
      uVar10 = cv_count - 1;
      uVar11 = (ulong)uVar10;
      if (knot[uVar11] <= knot[uVar9]) {
        if (this == (ON_TextLog *)0x0) goto joined_r0x004c255d;
        format = 
        "Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n"
        ;
        uVar8 = (ulong)(uint)cv_count;
      }
      else {
        if (iVar1 != 3) {
          lVar7 = 0;
          do {
            if (knot[lVar7 + 1] < knot[lVar7]) {
              if (this != (ON_TextLog *)0x0) {
                ON_TextLog::Print(this,
                                  "Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",
                                  lVar7,(ulong)((int)lVar7 + 1));
              }
              goto joined_r0x004c255d;
            }
            lVar7 = lVar7 + 1;
          } while (iVar1 + -3 != (int)lVar7);
        }
        if (uVar10 == 0) {
          return true;
        }
        uVar6 = uVar2;
        if (*knot < knot[(ulong)(uint)order - 1]) {
          lVar7 = 0;
          do {
            if (cv_count + -2 == (int)lVar7) {
              return true;
            }
            lVar3 = (ulong)(uint)order + lVar7;
            lVar4 = lVar7 + 1;
            lVar7 = lVar7 + 1;
          } while (knot[lVar4] < knot[lVar3]);
          uVar10 = uVar10 - (int)lVar7;
          uVar6 = uVar2 - (int)lVar7;
        }
        if (this == (ON_TextLog *)0x0) goto joined_r0x004c255d;
        uVar9 = (ulong)(uVar2 - uVar6);
        format = "Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n";
        uVar8 = (ulong)(uint)order;
        uVar11 = (ulong)(cv_count - uVar10);
      }
    }
    ON_TextLog::Print(this,format,uVar8,uVar9,uVar11);
  }
joined_r0x004c255d:
  if (((ulong)text_logx & 1) != 0) {
    return false;
  }
  bVar5 = ON_IsNotValid();
  return bVar5;
}

Assistant:

bool ON_IsValidKnotVector( int order, int cv_count, const double* knot, ON_TextLog* text_logx )
{
  // If low bit of text_log pointer is 1, then ON_Error is not called when the
  // knot vector is invalid.
  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  const double *k0, *k1;
  int i;
  if ( order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order = %d (should be >= 2 )\n",order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( cv_count < order )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count = %d (should be >= order=%d )\n",cv_count,order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( knot == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector knot array = nullptr.\n");
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  for ( i = 0; i < cv_count+order-2; i++ )
  {
    if ( !ON_IsValid(knot[i]) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector knot[%d]=%g is not valid.\n",i,knot[i]);
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
  }

  if ( !(knot[order-2] < knot[order-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n",
                       order,order-2,knot[order-2],order-1,knot[order-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( !(knot[cv_count-2] < knot[cv_count-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n",
                       cv_count,cv_count-2,knot[cv_count-2],cv_count-1,knot[cv_count-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  // entire array must be monotone increasing
  k0 = knot;
  k1 = knot+1;
  i = order + cv_count - 3;
  while (i--) {
    if ( !(*k1 >= *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",
                         order+cv_count-4-i, *k0, order+cv_count-3-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  // must have knot[i+order-1] > knot[i]
  k0 = knot;
  k1 = knot + order - 1;
  i = cv_count-1;
  while(i--) {
    if ( !(*k1 > *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n",
                         order, cv_count-2-i, *k0, cv_count-1-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  return true;
}